

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QRegularExpression *re)

{
  long lVar1;
  QRegularExpressionPrivate *pQVar2;
  QDebug *pQVar3;
  QRegularExpression *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QDebug local_48;
  QDebug local_40;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)re);
  *(undefined1 *)&((re->d).d.ptr)->errorCode = 0;
  pQVar3 = QDebug::operator<<((QDebug *)re,"QRegularExpression(");
  QRegularExpression::pattern((QString *)&local_60,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_60);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  local_48.stream = pQVar3->stream;
  (local_48.stream)->ref = (local_48.stream)->ref + 1;
  operator<<((Stream *)&local_40,
             (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)SUB84(&local_48,0));
  QDebug::operator<<(&local_40,')');
  QDebug::~QDebug(&local_40);
  QDebug::~QDebug(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  pQVar2 = (re->d).d.ptr;
  (re->d).d.ptr = (QRegularExpressionPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QRegularExpression &re)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QRegularExpression(" << re.pattern() << ", " << re.patternOptions() << ')';
    return debug;
}